

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O1

int32 feat_s2mfc2feat_live
                (feat_t *fcb,mfcc_t **uttcep,int32 *inout_ncep,int32 beginutt,int32 endutt,
                mfcc_t ***ofeat)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  uint32 nfr;
  mfcc_t **mfc;
  int32 nfr_00;
  uint uVar5;
  ulong uVar6;
  int32 nfr_01;
  long lVar7;
  int iVar8;
  mfcc_t **ppmVar9;
  int iVar10;
  long lVar11;
  size_t sVar12;
  
  if (endutt != 0 && beginutt != 0) {
    if (inout_ncep == (int32 *)0x0) {
      uVar6 = 0;
    }
    else {
      uVar6 = (ulong)(uint)*inout_ncep;
    }
    iVar10 = (int)uVar6;
    if (0 < iVar10) {
      iVar4 = fcb->window_size;
      lVar7 = (long)iVar4;
      iVar8 = fcb->cepsize;
      iVar3 = iVar10 + iVar4 * 2;
      mfc = (mfcc_t **)
            __ckd_calloc__((long)iVar3,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                           ,0x507);
      ppmVar9 = mfc + lVar7;
      memcpy(ppmVar9,uttcep,uVar6 * 8);
      feat_cmn(fcb,ppmVar9,iVar10,1,1);
      feat_agc(fcb,ppmVar9,iVar10,1,1);
      if (0 < lVar7) {
        sVar12 = (long)iVar8 << 2;
        lVar11 = 0;
        do {
          pvVar2 = *(void **)((long)fcb->cepbuf + lVar11);
          *(void **)((long)mfc + lVar11) = pvVar2;
          memcpy(pvVar2,*uttcep,sVar12);
          pvVar2 = *(void **)((long)fcb->cepbuf + lVar11 + lVar7 * 8);
          *(void **)((long)mfc + lVar11 + (ulong)(uint)(iVar10 + iVar4) * 8) = pvVar2;
          memcpy(pvVar2,uttcep[uVar6 - 1],sVar12);
          lVar11 = lVar11 + 8;
        } while (lVar7 * 8 - lVar11 != 0);
      }
      feat_compute_utt(fcb,mfc,iVar3,iVar4,ofeat);
      ckd_free(mfc);
      return iVar10;
    }
  }
  if (beginutt != 0) {
    fcb->bufpos = fcb->curpos;
  }
  iVar10 = fcb->window_size;
  iVar8 = fcb->bufpos - fcb->curpos;
  iVar4 = iVar8 + 0x100;
  if (-1 < iVar8) {
    iVar4 = iVar8;
  }
  if (beginutt != 0) {
    iVar8 = 0;
    if ((inout_ncep != (int32 *)0x0) && (0 < *inout_ncep)) {
      iVar8 = iVar10;
    }
    iVar4 = iVar4 + iVar8;
  }
  iVar8 = iVar10;
  if (endutt == 0) {
    iVar8 = 0;
  }
  iVar8 = iVar8 + iVar4;
  nfr_01 = 0;
  iVar4 = 0;
  if (inout_ncep != (int32 *)0x0) {
    iVar4 = *inout_ncep;
  }
  iVar3 = fcb->cepsize;
  if (0x100 < iVar4 + iVar8) {
    nfr_01 = 0x100 - (iVar10 + iVar8);
    if (inout_ncep != (int32 *)0x0) {
      *inout_ncep = nfr_01;
      nfr_01 = 0;
    }
    endutt = 0;
  }
  if (inout_ncep == (int32 *)0x0) {
    feat_cmn(fcb,uttcep,nfr_01,beginutt,endutt);
    nfr_00 = nfr_01;
  }
  else {
    feat_cmn(fcb,uttcep,*inout_ncep,beginutt,endutt);
    nfr_00 = *inout_ncep;
  }
  feat_agc(fcb,uttcep,nfr_00,beginutt,endutt);
  if (beginutt != 0) {
    iVar4 = nfr_01;
    if (inout_ncep != (int32 *)0x0) {
      iVar4 = *inout_ncep;
    }
    if (0 < iVar4) {
      if (0 < iVar10) {
        iVar4 = iVar10;
        do {
          iVar1 = fcb->bufpos;
          fcb->bufpos = iVar1 + 1;
          memcpy(fcb->cepbuf[iVar1],*uttcep,(long)iVar3 * 4);
          fcb->bufpos = fcb->bufpos % 0x100;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      fcb->curpos = fcb->bufpos;
      iVar8 = iVar8 - iVar10;
    }
  }
  sVar12 = (long)iVar3 << 2;
  lVar7 = 0;
  while( true ) {
    iVar4 = nfr_01;
    if (inout_ncep != (int32 *)0x0) {
      iVar4 = *inout_ncep;
    }
    if (iVar4 <= lVar7) break;
    iVar4 = fcb->bufpos;
    fcb->bufpos = iVar4 + 1;
    memcpy(fcb->cepbuf[iVar4],uttcep[lVar7],sVar12);
    fcb->bufpos = fcb->bufpos % 0x100;
    lVar7 = lVar7 + 1;
  }
  if (endutt != 0) {
    iVar4 = 0xff;
    if (fcb->bufpos != 0) {
      iVar4 = fcb->bufpos + -1;
    }
    if (0 < iVar10) {
      iVar3 = iVar10;
      do {
        iVar1 = fcb->bufpos;
        fcb->bufpos = iVar1 + 1;
        memcpy(fcb->cepbuf[iVar1],fcb->cepbuf[iVar4],sVar12);
        fcb->bufpos = fcb->bufpos % 0x100;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
  }
  nfr = (int)lVar7 + (iVar8 - iVar10);
  if ((int)nfr < 1) {
    nfr = 0;
  }
  else {
    uVar6 = 0;
    do {
      iVar4 = fcb->curpos;
      if (iVar4 + iVar10 < 0x100 && iVar10 <= iVar4) {
        ppmVar9 = fcb->cepbuf + iVar4;
      }
      else {
        if (-iVar10 <= iVar10) {
          iVar4 = iVar4 + (0x100 - iVar10);
          lVar11 = (long)-iVar10 + (long)iVar10;
          iVar3 = iVar10 * 2 + 1;
          do {
            fcb->tmpcepbuf[lVar11] = fcb->cepbuf[iVar4 % 0x100];
            lVar11 = lVar11 + 1;
            iVar4 = iVar4 + 1;
            iVar3 = iVar3 + -1;
          } while (iVar3 != 0);
        }
        ppmVar9 = fcb->tmpcepbuf + iVar10;
      }
      (*fcb->compute_feat)(fcb,ppmVar9,ofeat[uVar6]);
      iVar4 = fcb->curpos;
      uVar5 = iVar4 + 0x100;
      if (-1 < (int)(iVar4 + 1U)) {
        uVar5 = iVar4 + 1U;
      }
      fcb->curpos = (iVar4 - (uVar5 & 0xffffff00)) + 1;
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)((iVar8 - iVar10) + (int)lVar7));
    if (fcb->lda != (mfcc_t ***)0x0) {
      feat_lda_transform(fcb,ofeat,nfr);
    }
    if (fcb->subvecs != (int32 **)0x0) {
      feat_subvec_project(fcb,ofeat,nfr);
    }
  }
  return nfr;
}

Assistant:

int32
feat_s2mfc2feat_live(feat_t * fcb, mfcc_t ** uttcep, int32 *inout_ncep,
		     int32 beginutt, int32 endutt, mfcc_t *** ofeat)
{
    int32 win, cepsize, nbufcep;
    int32 i, j, nfeatvec;
    int32 zero = 0;

    /* Avoid having to check this everywhere. */
    if (inout_ncep == NULL) inout_ncep = &zero;

    /* Special case for entire utterances. */
    if (beginutt && endutt && *inout_ncep > 0)
        return feat_s2mfc2feat_block_utt(fcb, uttcep, *inout_ncep, ofeat);

    win = feat_window_size(fcb);
    cepsize = feat_cepsize(fcb);

    /* Empty the input buffer on start of utterance. */
    if (beginutt)
        fcb->bufpos = fcb->curpos;

    /* Calculate how much data is in the buffer already. */
    nbufcep = fcb->bufpos - fcb->curpos;
    if (nbufcep < 0)
	nbufcep = fcb->bufpos + LIVEBUFBLOCKSIZE - fcb->curpos;
    /* Add any data that we have to replicate. */
    if (beginutt && *inout_ncep > 0)
        nbufcep += win;
    if (endutt)
        nbufcep += win;

    /* Only consume as much input as will fit in the buffer. */
    if (nbufcep + *inout_ncep > LIVEBUFBLOCKSIZE) {
        /* We also can't overwrite the trailing window, hence the
         * reason why win is subtracted here. */
        *inout_ncep = LIVEBUFBLOCKSIZE - nbufcep - win;
        /* Cancel end of utterance processing. */
        endutt = FALSE;
    }

    /* FIXME: Don't modify the input! */
    feat_cmn(fcb, uttcep, *inout_ncep, beginutt, endutt);
    feat_agc(fcb, uttcep, *inout_ncep, beginutt, endutt);

    /* Replicate first frame into the first win frames if we're at the
     * beginning of the utterance and there was some actual input to
     * deal with.  (FIXME: Not entirely sure why that condition) */
    if (beginutt && *inout_ncep > 0) {
        for (i = 0; i < win; i++) {
            memcpy(fcb->cepbuf[fcb->bufpos++], uttcep[0],
                   cepsize * sizeof(mfcc_t));
            fcb->bufpos %= LIVEBUFBLOCKSIZE;
        }
        /* Move the current pointer past this data. */
        fcb->curpos = fcb->bufpos;
        nbufcep -= win;
    }

    /* Copy in frame data to the circular buffer. */
    for (i = 0; i < *inout_ncep; ++i) {
        memcpy(fcb->cepbuf[fcb->bufpos++], uttcep[i],
               cepsize * sizeof(mfcc_t));
        fcb->bufpos %= LIVEBUFBLOCKSIZE;
	++nbufcep;
    }

    /* Replicate last frame into the last win frames if we're at the
     * end of the utterance (even if there was no input, so we can
     * flush the output). */
    if (endutt) {
        int32 tpos; /* Index of last input frame. */
        if (fcb->bufpos == 0)
            tpos = LIVEBUFBLOCKSIZE - 1;
        else
            tpos = fcb->bufpos - 1;
        for (i = 0; i < win; ++i) {
            memcpy(fcb->cepbuf[fcb->bufpos++], fcb->cepbuf[tpos],
                   cepsize * sizeof(mfcc_t));
            fcb->bufpos %= LIVEBUFBLOCKSIZE;
        }
    }

    /* We have to leave the trailing window of frames. */
    nfeatvec = nbufcep - win;
    if (nfeatvec <= 0)
        return 0; /* Do nothing. */

    for (i = 0; i < nfeatvec; ++i) {
        /* Handle wraparound cases. */
        if (fcb->curpos - win < 0 || fcb->curpos + win >= LIVEBUFBLOCKSIZE) {
            /* Use tmpcepbuf for this case.  Actually, we just need the pointers. */
            for (j = -win; j <= win; ++j) {
                int32 tmppos =
                    (fcb->curpos + j + LIVEBUFBLOCKSIZE) % LIVEBUFBLOCKSIZE;
		fcb->tmpcepbuf[win + j] = fcb->cepbuf[tmppos];
            }
            fcb->compute_feat(fcb, fcb->tmpcepbuf + win, ofeat[i]);
        }
        else {
            fcb->compute_feat(fcb, fcb->cepbuf + fcb->curpos, ofeat[i]);
        }
	/* Move the read pointer forward. */
        ++fcb->curpos;
        fcb->curpos %= LIVEBUFBLOCKSIZE;
    }

    if (fcb->lda)
        feat_lda_transform(fcb, ofeat, nfeatvec);

    if (fcb->subvecs)
        feat_subvec_project(fcb, ofeat, nfeatvec);

    return nfeatvec;
}